

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

bool QtPrivate::QEqualityOperatorForType<QDBusPendingReply<QDBusVariant>,_true>::equals
               (QMetaTypeInterface *param_1,void *a,void *b)

{
  bool bVar1;
  QDBusVariant *in_RDX;
  QDBusVariant *in_RSI;
  long in_FS_OFFSET;
  QDBusPendingReply<QDBusVariant> *in_stack_ffffffffffffff88;
  QDBusPendingReply<QDBusVariant> local_48 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusPendingReply::operator_cast_to_QDBusVariant(in_stack_ffffffffffffff88);
  QDBusPendingReply::operator_cast_to_QDBusVariant(local_48);
  bVar1 = operator==(in_RSI,in_RDX);
  QDBusVariant::~QDBusVariant((QDBusVariant *)0x112d67);
  QDBusVariant::~QDBusVariant((QDBusVariant *)0x112d71);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool equals(const QMetaTypeInterface *, const void *a, const void *b)
    { return *reinterpret_cast<const T *>(a) == *reinterpret_cast<const T *>(b); }